

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcousticEmitterSystem.h
# Opt level: O2

void __thiscall
DIS::AcousticEmitterSystemData::setAcousticEmitterSystem
          (AcousticEmitterSystemData *this,AcousticEmitterSystem *pX)

{
  uchar uVar1;
  uchar uVar2;
  
  uVar1 = pX->_acousticFunction;
  uVar2 = pX->_acousticID;
  (this->_acousticEmitterSystem)._acousticName = pX->_acousticName;
  (this->_acousticEmitterSystem)._acousticFunction = uVar1;
  (this->_acousticEmitterSystem)._acousticID = uVar2;
  return;
}

Assistant:

class OPENDIS6_EXPORT AcousticEmitterSystem
{
protected:
  /** This field shall specify the system for a particular UA emitter. */
  unsigned short _acousticName; 

  /** This field shall describe the function of the acoustic system.  */
  unsigned char _acousticFunction; 

  /** This field shall specify the UA emitter identification number relative to a specific system. This field shall be represented by an 8-bit unsigned integer. This field allows the differentiation of multiple systems on an entity, even if in some instances two or more of the systems may be identical UA emitter types. Numbering of systems shall begin with the value 1.  */
  unsigned char _acousticID; 


 public:
    AcousticEmitterSystem();
    virtual ~AcousticEmitterSystem();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned short getAcousticName() const; 
    void setAcousticName(unsigned short pX); 

    unsigned char getAcousticFunction() const; 
    void setAcousticFunction(unsigned char pX); 

    unsigned char getAcousticID() const; 
    void setAcousticID(unsigned char pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const AcousticEmitterSystem& rhs) const;
}